

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstHelper.hpp
# Opt level: O3

TermList Kernel::SubstHelper::applyImpl<false,Shell::EqResWithDeletion>
                   (TermList trm,EqResWithDeletion *applicator,bool noSharing)

{
  Entry *pEVar1;
  TermList TVar2;
  undefined8 uStack_8;
  
  uStack_8._0_4_ = (uint)trm._content;
  if (((uint)uStack_8 & 3) != 3) {
    if (((uint)uStack_8 & 3) == 1) {
      uStack_8._4_4_ = (int)(trm._content >> 2);
      pEVar1 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::
               findEntry(&applicator->_subst,(uint *)((long)&uStack_8 + 4));
      if (pEVar1 == (Entry *)0x0) {
        TVar2._content = (uint64_t)(uStack_8._4_4_ * 4 + 1);
      }
      else {
        TVar2._content = (pEVar1->_val)._content;
      }
    }
    else {
      uStack_8 = trm._content;
      TVar2._content =
           (uint64_t)applyImpl<false,Shell::EqResWithDeletion>(trm._content,applicator,noSharing);
    }
    return (TermList)TVar2._content;
  }
  return (TermList)(ulong)((uint)uStack_8 | 3);
}

Assistant:

TermList SubstHelper::applyImpl(TermList trm, Applicator& applicator, bool noSharing)
{
  using namespace SubstHelper_Aux;

  if(trm.isOrdinaryVar()) {
    return applicator.apply(trm.var());
  }
  else if(trm.isSpecialVar()) {
    return SpecVarHandler<ProcessSpecVars>::apply(applicator, trm.var());
  }
  else {
    ASS(trm.isTerm());
    return TermList(applyImpl<ProcessSpecVars>(trm.term(), applicator, noSharing));
  }
}